

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O2

size_t portability_path_get_extension
                 (char *path,size_t path_size,char *extension,size_t extension_size)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (extension == (char *)0x0 || path == (char *)0x0) {
    return 0;
  }
  sVar1 = 0;
  for (uVar3 = 0; (uVar3 < path_size && (path[uVar3] != '\0')); uVar3 = uVar3 + 1) {
    extension[sVar1] = path[uVar3];
    sVar2 = sVar1 + 1;
    if (sVar1 + 1 == extension_size) {
      sVar2 = 0;
    }
    sVar1 = sVar2;
    if ((path[uVar3] & 0xfeU) == 0x2e) {
      sVar1 = 0;
    }
  }
  extension[sVar1] = '\0';
  return sVar1 + 1;
}

Assistant:

size_t portability_path_get_extension(const char *path, size_t path_size, char *extension, size_t extension_size)
{
	if (path == NULL || extension == NULL)
	{
		return 0;
	}

	size_t i, count;

	for (i = 0, count = 0; path[i] != '\0' && i < path_size; ++i)
	{
		extension[count++] = path[i];

		if (PORTABILITY_PATH_SEPARATOR(path[i]) || path[i] == '.' || count == extension_size)
		{
			count = 0;
		}
	}

	extension[count] = '\0';

	return count + 1;
}